

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O3

void Am_Choice_List_Outside_Stop_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *param_3,Am_Input_Event *param_4)

{
  Am_Input_Char stop_char;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Am_Object(&local_10,inter);
  Am_Object::Am_Object(&local_18,object);
  stop_char = Am_Default_Stop_Char;
  Am_Object::Am_Object(&local_20,&Am_No_Object);
  Am_Stop_Interactor(&local_10,&local_18,stop_char,&local_20,0,0,true);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_10);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void,
                 Am_Choice_List_Outside_Stop_Method,
                 (Am_Object & inter, Am_Object &object,
                  Am_Object & /* event_window */, Am_Input_Event * /* ev */))
{
  Am_INTER_TRACE_PRINT(inter, "Choice List outside STOP");
  Am_Stop_Interactor(inter, object);
}